

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utLimitBoneWeights.cpp
# Opt level: O1

void __thiscall
LimitBoneWeightsTest_testProcess_Test::TestBody(LimitBoneWeightsTest_testProcess_Test *this)

{
  vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
  *__s;
  pointer *ppWVar1;
  uint uVar2;
  aiBone *paVar3;
  iterator __position;
  pointer pWVar4;
  void *pvVar5;
  Weight WVar6;
  LimitBoneWeightsTest_testProcess_Test *pLVar7;
  bool bVar8;
  ulong *puVar9;
  aiMesh *paVar10;
  pointer pWVar11;
  vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
  *pvVar12;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  Weight local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  float local_4c;
  AssertHelper local_48;
  ulong *local_40;
  LimitBoneWeightsTest_testProcess_Test *local_38;
  
  Assimp::LimitBoneWeightsProcess::ProcessMesh
            ((this->super_LimitBoneWeightsTest).mProcess,(this->super_LimitBoneWeightsTest).mMesh);
  uVar2 = ((this->super_LimitBoneWeightsTest).mMesh)->mNumVertices;
  uVar16 = (ulong)uVar2;
  puVar9 = (ulong *)operator_new__(uVar16 * 0x18 + 8);
  *puVar9 = uVar16;
  __s = (vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
         *)(puVar9 + 1);
  local_40 = puVar9;
  if (uVar2 != 0) {
    memset(__s,0,((uVar16 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  if (((this->super_LimitBoneWeightsTest).mMesh)->mNumVertices != 0) {
    uVar16 = 0;
    pvVar12 = __s;
    do {
      std::
      vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
      ::reserve(pvVar12,4);
      uVar16 = uVar16 + 1;
      pvVar12 = pvVar12 + 1;
    } while (uVar16 < ((this->super_LimitBoneWeightsTest).mMesh)->mNumVertices);
  }
  paVar10 = (this->super_LimitBoneWeightsTest).mMesh;
  if (paVar10->mNumBones != 0) {
    uVar16 = 0;
    do {
      paVar3 = paVar10->mBones[uVar16];
      if (paVar3->mNumWeights != 0) {
        uVar14 = 0;
        do {
          local_60.mWeight = paVar3->mWeights[uVar14].mWeight;
          pvVar12 = __s + paVar3->mWeights[uVar14].mVertexId;
          local_60.mBone = (uint)uVar16;
          __position._M_current =
               (pvVar12->
               super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pvVar12->
              super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
            ::_M_realloc_insert<Assimp::LimitBoneWeightsProcess::Weight>
                      (pvVar12,__position,&local_60);
          }
          else {
            WVar6.mWeight = local_60.mWeight;
            WVar6.mBone = local_60.mBone;
            *__position._M_current = WVar6;
            ppWVar1 = &(pvVar12->
                       super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppWVar1 = *ppWVar1 + 1;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < paVar3->mNumWeights);
      }
      uVar16 = uVar16 + 1;
      paVar10 = (this->super_LimitBoneWeightsTest).mMesh;
    } while (uVar16 < paVar10->mNumBones);
  }
  if (((this->super_LimitBoneWeightsTest).mMesh)->mNumVertices != 0) {
    uVar16 = 0;
    local_38 = this;
    do {
      local_68.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)(puVar9[uVar16 * 3 + 2] -
                  (long)__s[uVar16].
                        super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3);
      local_48.data_._0_4_ = 4;
      testing::internal::CmpHelperLE<unsigned_long,unsigned_int>
                ((internal *)&local_60,"asWeights[i].size()","4U",(unsigned_long *)&local_68,
                 (uint *)&local_48);
      if ((char)local_60.mBone == '\0') {
        testing::Message::Message((Message *)&local_68);
        pcVar15 = "";
        if (local_58.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar15 = ((local_58.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utLimitBoneWeights.cpp"
                   ,0x7d,pcVar15);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar8 = testing::internal::IsTrue(true);
          if ((bVar8) &&
             (local_68.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_68.ptr_ + 8))();
          }
          local_68.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pLVar7 = local_38;
      local_4c = 0.0;
      pWVar11 = __s[uVar16].
                super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pWVar4 = __s[uVar16].
               super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pWVar11 != pWVar4) {
        local_4c = 0.0;
        do {
          local_4c = local_4c + pWVar11->mWeight;
          pWVar11 = pWVar11 + 1;
        } while (pWVar11 != pWVar4);
      }
      local_68.ptr_._0_4_ = 0x3f733333;
      testing::internal::CmpHelperGE<float,float>
                ((internal *)&local_60,"fSum","0.95F",&local_4c,(float *)&local_68);
      if ((char)local_60.mBone == '\0') {
        testing::Message::Message((Message *)&local_68);
        pcVar15 = "";
        if (local_58.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar15 = ((local_58.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utLimitBoneWeights.cpp"
                   ,0x82,pcVar15);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar8 = testing::internal::IsTrue(true);
          if ((bVar8) &&
             (local_68.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_68.ptr_ + 8))();
          }
          local_68.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_68.ptr_._0_4_ = 0x3f851eb8;
      testing::internal::CmpHelperLE<float,float>
                ((internal *)&local_60,"fSum","1.04F",&local_4c,(float *)&local_68);
      if ((char)local_60.mBone == '\0') {
        testing::Message::Message((Message *)&local_68);
        pcVar15 = "";
        if (local_58.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar15 = ((local_58.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utLimitBoneWeights.cpp"
                   ,0x83,pcVar15);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar8 = testing::internal::IsTrue(true);
          if ((bVar8) &&
             (local_68.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_68.ptr_ + 8))();
          }
          local_68.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar16 = uVar16 + 1;
    } while (uVar16 < ((pLVar7->super_LimitBoneWeightsTest).mMesh)->mNumVertices);
  }
  puVar9 = local_40;
  if (*local_40 != 0) {
    lVar13 = *local_40 * 0x18;
    do {
      pvVar5 = *(void **)((long)puVar9 + lVar13 + -0x10);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5);
      }
      lVar13 = lVar13 + -0x18;
    } while (lVar13 != 0);
  }
  operator_delete__(puVar9);
  return;
}

Assistant:

TEST_F(LimitBoneWeightsTest, testProcess) {
    // execute the step on the given data
    mProcess->ProcessMesh(mMesh);

    // check whether everything is ok ...
    typedef std::vector<LimitBoneWeightsProcess::Weight> VertexWeightList;
    VertexWeightList* asWeights = new VertexWeightList[mMesh->mNumVertices];

    for (unsigned int i = 0; i < mMesh->mNumVertices; ++i) {
        asWeights[i].reserve(4);
    }

    // sort back as per-vertex lists
    for (unsigned int i = 0; i < mMesh->mNumBones;++i) {
        aiBone& pcBone = **(mMesh->mBones+i);
        for (unsigned int q = 0; q < pcBone.mNumWeights;++q) {
            aiVertexWeight weight = pcBone.mWeights[q];
            asWeights[weight.mVertexId].push_back(LimitBoneWeightsProcess::Weight (i,weight.mWeight));
        }
    }

    // now validate the size of the lists and check whether all weights sum to 1.0f
    for (unsigned int i = 0; i < mMesh->mNumVertices;++i) {
        EXPECT_LE(asWeights[i].size(), 4U);
        float fSum = 0.0f;
        for (VertexWeightList::const_iterator iter =  asWeights[i].begin(); iter != asWeights[i].end();++iter) {
            fSum += (*iter).mWeight;
        }
        EXPECT_GE(fSum, 0.95F);
        EXPECT_LE(fSum, 1.04F);
    }

    // delete allocated storage
    delete[] asWeights;

    // everything seems to be OK
}